

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

VkResult shim_vkGetSwapchainImagesKHR
                   (VkDevice device,VkSwapchainKHR swapchain,uint32_t *pSwapchainImageCount,
                   VkImage *pSwapchainImages)

{
  initializer_list<VkImage_T_*> __l;
  VkResult VVar1;
  allocator<VkImage_T_*> local_69;
  VkImage_T *local_68;
  VkImage_T *local_60;
  VkImage_T *local_58;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> images;
  VkImage *pSwapchainImages_local;
  uint32_t *pSwapchainImageCount_local;
  VkSwapchainKHR swapchain_local;
  VkDevice device_local;
  
  images.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pSwapchainImages;
  local_68 = get_uint64_handle<VkImage_T*>(0xedd0);
  local_60 = get_uint64_handle<VkImage_T*>(0xedd1);
  local_58 = get_uint64_handle<VkImage_T*>(0xedd1);
  local_50 = &local_68;
  local_48 = 3;
  std::allocator<VkImage_T_*>::allocator(&local_69);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)local_40,__l,&local_69);
  std::allocator<VkImage_T_*>::~allocator(&local_69);
  VVar1 = fill_out_count_pointer_pair<VkImage_T*>
                    ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)local_40,
                     pSwapchainImageCount,
                     images.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)local_40);
  return VVar1;
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkGetSwapchainImagesKHR(
    [[maybe_unused]] VkDevice device, [[maybe_unused]] VkSwapchainKHR swapchain, uint32_t* pSwapchainImageCount, VkImage* pSwapchainImages) {

    std::vector<VkImage> images{ get_uint64_handle<VkImage>(0x0000EDD0U),
        get_uint64_handle<VkImage>(0x0000EDD1U),
        get_uint64_handle<VkImage>(0x0000EDD1U) };
    return fill_out_count_pointer_pair(images, pSwapchainImageCount, pSwapchainImages);
}